

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

Gia_Man_t * Gia_ManGenerateExtraAig(int nBoxes,int nIns,int nOuts)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int pInLits [16];
  int pOutLits [16];
  int local_b8 [16];
  int local_78 [18];
  
  p = Gia_ManStart(nBoxes * 0x14);
  if ((0xf < nIns) || (0xf < nOuts)) {
    __assert_fail("nIns < 16 && nOuts < 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                  ,0x28d,"Gia_Man_t *Gia_ManGenerateExtraAig(int, int, int)");
  }
  if (0 < nIns) {
    uVar7 = 0;
    do {
      pGVar6 = Gia_ManAppendObj(p);
      uVar1 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) {
LAB_005dac63:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) goto LAB_005dac63;
      local_b8[uVar7] = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
      uVar7 = uVar7 + 1;
    } while ((uint)nIns != uVar7);
  }
  iVar3 = Gia_ManAppendXor(p,local_b8[0],local_b8[1]);
  local_78[0] = Gia_ManAppendXor(p,iVar3,local_b8[2]);
  if ((-1 < local_b8[1]) && (-1 < local_b8[2])) {
    uVar4 = Gia_ManAppendAnd(p,local_b8[1] ^ 1,local_b8[2] ^ 1);
    if (-1 < (int)uVar4) {
      uVar4 = Gia_ManAppendAnd(p,local_b8[0],uVar4 ^ 1);
      uVar5 = Gia_ManAppendAnd(p,local_b8[1],local_b8[2]);
      if (-1 < (int)uVar4) {
        if (-1 < (int)uVar5) {
          uVar4 = Gia_ManAppendAnd(p,uVar4 ^ 1,uVar5 ^ 1);
          if (-1 < (int)uVar4) {
            local_78[1] = uVar4 ^ 1;
            if (0 < nBoxes) {
              iVar3 = 0;
              do {
                if (0 < nOuts) {
                  uVar7 = 0;
                  do {
                    Gia_ManAppendCo(p,local_78[uVar7]);
                    uVar7 = uVar7 + 1;
                  } while ((uint)nOuts != uVar7);
                }
                iVar3 = iVar3 + 1;
              } while (iVar3 != nBoxes);
            }
            return p;
          }
        }
      }
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf4,"int Abc_LitNot(int)");
}

Assistant:

Gia_Man_t * Gia_ManGenerateExtraAig( int nBoxes, int nIns, int nOuts )
{
    Gia_Man_t * pNew = Gia_ManStart( nBoxes * 20 );
    int i, k, pInLits[16], pOutLits[16];
    assert( nIns < 16 && nOuts < 16 );
    for ( i = 0; i < nIns; i++ )
        pInLits[i] = Gia_ManAppendCi( pNew );
    pOutLits[0] = Gia_ManAppendXor( pNew, Gia_ManAppendXor(pNew, pInLits[0], pInLits[1]), pInLits[2] );
    pOutLits[1] = Gia_ManAppendMaj( pNew, pInLits[0], pInLits[1], pInLits[2] );
    for ( i = 0; i < nBoxes; i++ )
        for ( k = 0; k < nOuts; k++ )
            Gia_ManAppendCo( pNew, pOutLits[k] );
    return pNew;
}